

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginWidthConvertibleToMonthsTernaryOperator *this,interval_t bucket_width,date_t ts,
          date_t origin)

{
  bool bVar1;
  int32_t ts_months;
  int32_t origin_months;
  date_t dVar2;
  
  dVar2.days = bucket_width.micros._0_4_;
  bVar1 = Value::IsFinite<duckdb::date_t>(dVar2);
  if (bVar1) {
    ts_months = EpochMonths<duckdb::date_t>(dVar2);
    origin_months = EpochMonths<duckdb::date_t>(ts);
    dVar2 = WidthConvertibleToMonthsCommon((int32_t)this,ts_months,origin_months);
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(dVar2);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			int32_t origin_months = EpochMonths(origin);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, origin_months));
		}